

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O3

type __thiscall cpp_client::Any::as<int>(Any *this)

{
  char *__s2;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 *puVar2;
  
  iVar1 = (*((this->data_)._M_t.
             super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
             ._M_t.
             super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
             .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl)->_vptr_holder[2]
          )();
  __s2 = *(char **)(CONCAT44(extraout_var,iVar1) + 8);
  if (_put != __s2) {
    if (*_put != '*') {
      iVar1 = strcmp(_put,__s2);
      if (iVar1 == 0) goto LAB_0011fc51;
    }
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = std::istream::operator>>;
    __cxa_throw(puVar2,&std::bad_cast::typeinfo,std::bad_cast::~bad_cast);
  }
LAB_0011fc51:
  iVar1 = (*((this->data_)._M_t.
             super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
             ._M_t.
             super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
             .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl)->_vptr_holder[3]
          )();
  return (type)CONCAT44(extraout_var_00,iVar1);
}

Assistant:

typename std::enable_if<std::is_fundamental<T>::value || std::is_pointer<T>::value, T&>::type as()
   {
      if(typeid(T) != data_->type())
      {
         throw std::bad_cast{};
      }
      return *static_cast<T*>(data_->get());
   }